

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack_test.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  int iVar1;
  char *__assertion;
  int local_1c;
  
  local_1c = 1;
  ConcurrentStack<int>::push(&stack,&local_1c);
  iVar1 = ConcurrentStack<int>::top(&stack);
  if (iVar1 == 1) {
    local_1c = 2;
    ConcurrentStack<int>::push(&stack,&local_1c);
    local_1c = 3;
    ConcurrentStack<int>::push(&stack,&local_1c);
    local_1c = 4;
    ConcurrentStack<int>::push(&stack,&local_1c);
    local_1c = 5;
    ConcurrentStack<int>::push(&stack,&local_1c);
    iVar1 = ConcurrentStack<int>::top(&stack);
    if (iVar1 == 5) {
      iVar1 = ConcurrentStack<int>::pop(&stack);
      if (iVar1 == 5) {
        iVar1 = ConcurrentStack<int>::pop(&stack);
        if (iVar1 == 4) {
          iVar1 = ConcurrentStack<int>::pop(&stack);
          if (iVar1 == 3) {
            iVar1 = ConcurrentStack<int>::pop(&stack);
            if (iVar1 == 2) {
              iVar1 = ConcurrentStack<int>::pop(&stack);
              if (iVar1 == 1) {
                return 0;
              }
              __assertion = "stack.pop() == 1";
              __line = 0x1a;
            }
            else {
              __assertion = "stack.pop() == 2";
              __line = 0x19;
            }
          }
          else {
            __assertion = "stack.pop() == 3";
            __line = 0x18;
          }
        }
        else {
          __assertion = "stack.pop() == 4";
          __line = 0x17;
        }
      }
      else {
        __assertion = "stack.pop() == 5";
        __line = 0x16;
      }
    }
    else {
      __assertion = "stack.top() == 5";
      __line = 0x15;
    }
  }
  else {
    __assertion = "stack.top() == 1";
    __line = 0x10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/NJdevPro[P]Behaviour-Tree/src/ConcurrentStack_test.cpp"
                ,__line,"int main()");
}

Assistant:

int main()
{
    //assert(stack.top() == 0);
    //assert(stack.pop() == 0);
    stack.push(1);
    assert(stack.top() == 1);
    stack.push(2);
    stack.push(3);
    stack.push(4);
    stack.push(5);
    assert(stack.top() == 5);
    assert(stack.pop() == 5);
    assert(stack.pop() == 4);
    assert(stack.pop() == 3);
    assert(stack.pop() == 2);
    assert(stack.pop() == 1);
}